

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O0

void run_test<unsigned_int>(void)

{
  char *pcVar1;
  DivideTest<unsigned_int> dt;
  char msg [64];
  DivideTest<unsigned_int> *in_stack_ffffffffffffffb0;
  char local_48 [72];
  
  pcVar1 = type_name<unsigned_int>::get_name();
  snprintf(local_48,0x40,"Testing %s\n",pcVar1);
  std::operator<<((ostream *)&std::cout,local_48);
  DivideTest<unsigned_int>::DivideTest(in_stack_ffffffffffffffb0);
  DivideTest<unsigned_int>::run((DivideTest<unsigned_int> *)msg._0_8_);
  return;
}

Assistant:

void run_test() {
    char msg[64];
    snprintf(msg, sizeof(msg), "Testing %s\n", type_name<T>::get_name());
    PRINT_INFO(msg);
    DivideTest<T> dt;
    dt.run();
}